

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O3

pair<int,_pbrt::LightBounds> * __thiscall
pbrt::BVHLightSampler::buildBVH
          (pair<int,_pbrt::LightBounds> *__return_storage_ptr__,BVHLightSampler *this,
          vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          *bvhLights,int start,int end,uint32_t bitTrail,int depth,Allocator alloc)

{
  float *pfVar1;
  float *pfVar2;
  pointer ppVar3;
  LightBVHNode *pLVar4;
  LightBounds *pLVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  LightBVHNode *pLVar16;
  float fVar17;
  ushort uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  byte bVar23;
  size_t sVar24;
  uint32_t uVar25;
  BVHLightSampler *pBVar26;
  ulong uVar27;
  int i;
  int iVar28;
  long lVar29;
  ulong uVar30;
  pair<int,_pbrt::LightBounds> *ppVar31;
  bool bVar32;
  undefined4 in_register_0000000c;
  float *pfVar33;
  long lVar34;
  int iVar35;
  pointer ppVar36;
  uint uVar37;
  pointer ppVar38;
  pointer ppVar39;
  long lVar40;
  int iVar41;
  float fVar42;
  undefined1 auVar44 [16];
  Float FVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 uVar52;
  undefined8 uVar53;
  float fVar54;
  undefined8 uVar55;
  undefined1 auVar56 [16];
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined1 auVar57 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  pair<int,_pbrt::LightBounds> child1;
  LightBounds lb;
  CompactLightBounds cb;
  Float cost [11];
  pair<int,_pbrt::LightBounds> child0;
  pair<int,_pbrt::LightBounds> *args_5;
  uint32_t local_4ac;
  undefined8 local_4a8;
  pair<int,_pbrt::LightBounds> local_4a0;
  int local_464;
  int local_460;
  float local_45c;
  pair<int,_pbrt::LightBounds> *local_458;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  *local_450;
  BVHLightSampler *local_448;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  pair<int,_pbrt::LightBounds> local_420;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  Bounds3f local_388;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  LightBounds local_344;
  float local_30c [5];
  undefined8 auStack_2f8 [3];
  pair<int,_pbrt::LightBounds> local_2e0 [12];
  undefined1 auVar43 [16];
  undefined1 auVar66 [64];
  
  local_4a8 = CONCAT44(in_register_0000000c,start);
  local_2e0[0].first = start;
  local_4a0.first = end;
  local_4ac = bitTrail;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
               ,0x89,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])"start",
               (char (*) [4])0x568432,(char (*) [6])"start",&local_2e0[0].first,
               (char (*) [4])0x568432,&local_4a0.first);
  }
  lVar29 = (long)start;
  local_458 = __return_storage_ptr__;
  local_450 = bvhLights;
  if (end - start == 1) {
    sVar24 = (this->nodes).nStored;
    CompactLightBounds::CompactLightBounds
              ((CompactLightBounds *)&local_4a0,
               &(bvhLights->
                super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar29].second,&this->allLightBounds);
    uVar37 = (bvhLights->
             super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar29].first;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
         (float)CONCAT71(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_,
                         local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_);
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
         local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    local_2e0[0].first = local_4a0.first;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
         (float)(uVar37 | 0x80000000);
    pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::
    push_back(&this->nodes,(LightBVHNode *)local_2e0);
    HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
    ::Insert(&this->lightToBitTrail,(this->lights).ptr + (int)uVar37,&local_4ac);
    ppVar36 = (local_450->
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_458->first = (int)sVar24;
    pLVar5 = &ppVar36[lVar29].second;
    local_420._0_8_ = *(undefined8 *)&(pLVar5->bounds).pMin;
    local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ =
         *(undefined8 *)((long)&(pLVar5->bounds).pMin + 8);
    uVar52 = *(undefined8 *)((long)&(pLVar5->bounds).pMax + 4);
    uVar53._0_4_ = pLVar5->phi;
    uVar53._4_4_ = (pLVar5->w).super_Tuple3<pbrt::Vector3,_float>.x;
    pfVar33 = (float *)((long)&ppVar36[lVar29].second.bounds.pMax + 8);
    uVar55 = *(undefined8 *)pfVar33;
    uVar58 = *(undefined8 *)(pfVar33 + 2);
    uVar59 = *(undefined8 *)(pfVar33 + 4);
    uVar60 = *(undefined8 *)(pfVar33 + 6);
  }
  else {
    auVar70._8_4_ = 0xff7fffff;
    auVar70._0_8_ = 0xff7fffffff7fffff;
    auVar70._12_4_ = 0xff7fffff;
    auVar65._8_4_ = 0x7f7fffff;
    auVar65._0_8_ = 0x7f7fffff7f7fffff;
    auVar65._12_4_ = 0x7f7fffff;
    auVar66 = ZEXT1664(auVar65);
    auVar67 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
    auVar71 = ZEXT464(0xff7fffff);
    auVar69 = ZEXT464(0x7f7fffff);
    local_3b8 = (long)end;
    local_3b0 = lVar29 * 0x38;
    pfVar33 = (float *)((long)&(bvhLights->
                               super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar29].second.bounds.pMax
                       + 8);
    lVar34 = local_3b8 - lVar29;
    auVar44 = auVar69._0_16_;
    auVar43 = auVar71._0_16_;
    local_370 = auVar70;
    do {
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)(pfVar33 + -5);
      auVar65 = vminps_avx(auVar63,auVar65);
      auVar44 = vminss_avx(ZEXT416((uint)pfVar33[-3]),auVar44);
      uVar7 = ((Tuple3<pbrt::Point3,_float> *)(pfVar33 + -2))->x;
      uVar11 = ((Tuple3<pbrt::Point3,_float> *)(pfVar33 + -2))->y;
      auVar62._4_4_ = uVar11;
      auVar62._0_4_ = uVar7;
      auVar62._8_8_ = 0;
      auVar70 = vmaxps_avx(auVar62,auVar70);
      local_388.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar65);
      local_388.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar44._0_4_;
      local_388.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar70);
      auVar43 = vmaxss_avx(ZEXT416((uint)*pfVar33),auVar43);
      local_388.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar43._0_4_;
      pfVar1 = pfVar33 + -3;
      pfVar2 = pfVar33 + -5;
      uVar8 = ((Tuple3<pbrt::Point3,_float> *)(pfVar33 + -2))->x;
      uVar12 = ((Tuple3<pbrt::Point3,_float> *)(pfVar33 + -2))->y;
      fVar6 = *pfVar33;
      pfVar33 = pfVar33 + 0xe;
      lVar34 = lVar34 + -1;
      auVar64._0_4_ = ((float)*(undefined8 *)pfVar2 + (float)uVar8) * 0.5;
      auVar64._4_4_ = ((float)((ulong)*(undefined8 *)pfVar2 >> 0x20) + (float)uVar12) * 0.5;
      auVar64._8_8_ = 0;
      auVar62 = vminps_avx(auVar64,auVar66._0_16_);
      auVar66 = ZEXT1664(auVar62);
      auVar63 = ZEXT416((uint)((*pfVar1 + fVar6) * 0.5));
      auVar46 = vminss_avx(auVar63,auVar69._0_16_);
      auVar69 = ZEXT1664(auVar46);
      local_370 = vmaxps_avx(auVar64,local_370);
      auVar63 = vmaxss_avx(auVar63,auVar71._0_16_);
      auVar71 = ZEXT1664(auVar63);
    } while (lVar34 != 0);
    local_430 = vmovshdup_avx(auVar62);
    local_440 = vmovshdup_avx(local_370);
    uVar52 = vcmpps_avx512vl(auVar62,local_370,1);
    uVar18 = (ushort)uVar52;
    local_3a0 = local_3b0 + 4;
    local_3a8 = local_3b8 - lVar29;
    iVar28 = -1;
    auVar61 = ZEXT864(0) << 0x20;
    iVar41 = -1;
    iVar35 = 0;
    fVar6 = local_440._0_4_ - local_430._0_4_;
    auVar57 = ZEXT464(0x7f800000);
    uVar55 = vcmpss_avx512f(auVar46,auVar63,1);
    bVar23 = (byte)uVar55;
    fVar17 = auVar63._0_4_ - auVar46._0_4_;
    local_3d0 = vsubps_avx(local_370,auVar62);
    local_448 = this;
    do {
      local_3e0 = auVar57._0_16_;
      fVar68 = auVar69._0_4_;
      fVar42 = local_370._0_4_;
      fVar54 = auVar66._0_4_;
      if (iVar35 != 0) {
        fVar42 = local_440._0_4_;
        fVar54 = local_430._0_4_;
        if (iVar35 != 1) {
          fVar42 = auVar71._0_4_;
          fVar54 = fVar68;
        }
      }
      if ((fVar42 != fVar54) || (NAN(fVar42) || NAN(fVar54))) {
        auVar43._8_4_ = 0xff7fffff;
        auVar43._0_8_ = 0xff7fffffff7fffff;
        auVar43._12_4_ = 0xff7fffff;
        lVar29 = 0x18;
        do {
          *(undefined8 *)((long)auStack_2f8 + lVar29) = 0x7f7fffff7f7fffff;
          *(undefined8 *)((long)auStack_2f8 + lVar29 + 8) = 0xff7fffff7f7fffff;
          uVar55 = vmovlps_avx(auVar43);
          *(undefined8 *)((long)auStack_2f8 + lVar29 + 0x10) = uVar55;
          *(undefined1 (*) [16])((long)&local_2e0[0].first + lVar29) = auVar61._0_16_;
          lVar29 = lVar29 + 0x34;
          lVar34 = local_3a0;
          lVar40 = local_3a8;
          local_464 = iVar41;
          local_460 = iVar28;
          local_360 = auVar66._0_16_;
        } while (lVar29 != 0x288);
        do {
          uVar59 = local_420._0_8_;
          ppVar36 = (bvhLights->
                    super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar55 = *(undefined8 *)((long)&ppVar36->first + lVar34);
          uVar58 = *(undefined8 *)((long)&(ppVar36->second).bounds.pMin + lVar34 + 8);
          auVar46._0_4_ = auVar67._0_4_ * ((float)uVar55 + (float)uVar58);
          auVar46._4_4_ =
               auVar67._4_4_ * ((float)((ulong)uVar55 >> 0x20) + (float)((ulong)uVar58 >> 0x20));
          auVar46._8_4_ = auVar67._8_4_ * 0.0;
          auVar46._12_4_ = auVar67._12_4_ * 0.0;
          auVar70 = vsubps_avx(auVar46,auVar66._0_16_);
          auVar43 = vdivps_avx512vl(auVar70,local_3d0);
          bVar32 = (bool)((byte)uVar52 & 1);
          auVar44._0_4_ = (uint)bVar32 * auVar43._0_4_ | (uint)!bVar32 * auVar70._0_4_;
          bVar32 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar44._4_4_ = (uint)bVar32 * auVar43._4_4_ | (uint)!bVar32 * auVar70._4_4_;
          bVar32 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar44._8_4_ = (uint)bVar32 * auVar43._8_4_ | (uint)!bVar32 * auVar70._8_4_;
          bVar32 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar44._12_4_ = (uint)bVar32 * auVar43._12_4_ | (uint)!bVar32 * auVar70._12_4_;
          if ((float)local_430._0_4_ < (float)local_440._0_4_) {
            auVar70 = vmovshdup_avx(auVar70);
            auVar56._0_4_ = auVar70._0_4_ / fVar6;
            auVar56._4_12_ = auVar70._4_12_;
            auVar70 = vinsertps_avx(auVar44,auVar56,0x10);
          }
          else {
            auVar70 = vblendps_avx(auVar44,auVar70,2);
          }
          fVar42 = auVar70._0_4_;
          if (iVar35 != 0) {
            if (iVar35 == 1) {
              auVar70 = vmovshdup_avx(auVar70);
              fVar42 = auVar70._0_4_;
            }
            else {
              fVar42 = (*(float *)((long)&(ppVar36->second).bounds.pMin + lVar34 + 4) +
                       *(float *)((long)&(ppVar36->second).bounds.pMax + lVar34 + 4U)) * 0.5 -
                       fVar68;
              fVar42 = (float)((uint)(bVar23 & 1) * (int)(fVar42 / fVar17) +
                              (uint)!(bool)(bVar23 & 1) * (int)fVar42);
            }
          }
          local_420._0_8_ = local_420._0_8_ & 0xffffffff00000000;
          uVar37 = (uint)(fVar42 * 12.0);
          if (uVar37 == 0xc) {
            uVar37 = 0xb;
          }
          local_4a0.first = uVar37;
          if ((int)uVar37 < 0) {
            iVar41 = 0xab;
            args_5 = &local_420;
            ppVar31 = &local_4a0;
            goto LAB_00366c51;
          }
          local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = SUB84(uVar59,4);
          local_420.first = 0xc;
          if (0xb < uVar37) {
            iVar41 = 0xac;
            args_5 = &local_420;
            ppVar31 = &local_4a0;
            goto LAB_00366c10;
          }
          uVar30 = (ulong)uVar37;
          pLVar5 = (LightBounds *)(&local_2e0[0].first + uVar30 * 0xd);
          Union((LightBounds *)&local_4a0,pLVar5,(LightBounds *)((long)&ppVar36->first + lVar34));
          auVar67 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
          auVar66 = ZEXT1664(local_360);
          auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
          lVar40 = lVar40 + -1;
          *(ulong *)((long)&(&local_2e0[0].second)[uVar30].bounds.pMax.
                            super_Tuple3<pbrt::Point3,_float>.x + 1) =
               CONCAT17(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_,
                        local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_);
          *(ulong *)((long)&(&local_2e0[0].second)[uVar30].bounds.pMax.
                            super_Tuple3<pbrt::Point3,_float>.z + 1) =
               CONCAT17(local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_,
                        local_4a0.second._21_7_);
          *(ulong *)((long)&(&local_2e0[0].second)[uVar30].w.super_Tuple3<pbrt::Vector3,_float>.x +
                    1) = CONCAT17(local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_,
                                  local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_);
          *(undefined8 *)
           ((long)&(&local_2e0[0].second)[uVar30].w.super_Tuple3<pbrt::Vector3,_float>.z + 1) =
               local_4a0.second._37_8_;
          (pLVar5->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_4a0.first;
          (pLVar5->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
               local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          (&local_2e0[0].second)[uVar30].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          (&local_2e0[0].second)[uVar30].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
               local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          (&local_2e0[0].second)[uVar30].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
               (float)(int)CONCAT71(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.
                                    _1_7_,local_4a0.second.bounds.pMax.
                                          super_Tuple3<pbrt::Point3,_float>.x._0_1_);
          (&local_2e0[0].second)[uVar30].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          *(ulong *)&(&local_2e0[0].second)[uVar30].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z
               = CONCAT71(local_4a0.second._21_7_,
                          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_);
          lVar34 = lVar34 + 0x38;
        } while (lVar40 != 0);
        lVar34 = 0x34;
        lVar29 = 0;
        do {
          auVar47._8_4_ = 0xff7fffff;
          auVar47._0_8_ = 0xff7fffffff7fffff;
          auVar47._12_4_ = 0xff7fffff;
          lVar40 = 0;
          local_4a0.first = 0x7f7fffff;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = -3.4028235e+38;
          local_420.first = 0x7f7fffff;
          local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
          local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
          local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = -3.4028235e+38;
          uVar55 = vmovlps_avx(auVar47);
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
               (undefined1)uVar55;
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
               SUB87((ulong)uVar55 >> 8,0);
          uVar55 = vmovlps_avx(auVar47);
          local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar55;
          local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)((ulong)uVar55 >> 0x20);
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ = 0;
          local_4a0.second._21_7_ = 0;
          local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = auVar61[8];
          local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ = auVar61._9_7_;
          local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          local_420.second.phi = 0.0;
          local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.x = auVar61._8_4_;
          local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.y = auVar61._12_4_;
          uVar30 = local_4a0._0_8_;
          uVar55 = local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          do {
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ = uVar55;
            local_4a0._0_8_ = uVar30;
            Union(&local_344,(LightBounds *)&local_4a0,
                  (LightBounds *)((long)&local_2e0[0].first + lVar40));
            local_4a0.second._37_8_ = local_344._41_8_;
            uVar30._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar30._4_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar55._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar55._4_4_ = local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            lVar40 = lVar40 + 0x34;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>._5_7_;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_ =
                 local_344.cosTheta_o._0_1_;
            local_4a0.first = (int)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ =
                 local_344.phi._0_1_;
            local_4a0.second._21_7_ = local_344._25_7_;
          } while (lVar34 != lVar40);
          local_398 = lVar29 + 1;
          lVar40 = lVar34;
          uVar27 = local_420._0_8_;
          uVar58 = local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          local_390 = lVar29;
          do {
            local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ = uVar58;
            local_420._0_8_ = uVar27;
            Union(&local_344,(LightBounds *)&local_420,
                  (LightBounds *)((long)&local_2e0[0].first + lVar40));
            pBVar26 = local_448;
            uVar27._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar27._4_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar58._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar58._4_4_ = local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            lVar40 = lVar40 + 0x34;
            local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)CONCAT31(local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._1_3_,
                                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_);
            local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.y =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.z;
            local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_ =
                 local_344.cosTheta_o._0_1_;
            local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_ =
                 local_344.cosTheta_o._1_3_;
            local_420.second._40_5_ = local_344._44_5_;
            local_420.first = (int)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                 (float)CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
            local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                 (float)CONCAT71(local_344._25_7_,local_344.phi._0_1_);
            local_420.second.phi = local_344.w.super_Tuple3<pbrt::Vector3,_float>.x;
          } while (lVar40 != 0x270);
          local_45c = EvaluateCost(local_448,(LightBounds *)&local_4a0,&local_388,iVar35);
          FVar45 = EvaluateCost(pBVar26,(LightBounds *)&local_420,&local_388,iVar35);
          lVar34 = lVar34 + 0x34;
          auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
          local_30c[local_390 + -1] = FVar45 + local_45c;
          lVar29 = local_398;
        } while (local_398 != 0xb);
        lVar29 = 1;
        iVar41 = local_464;
        iVar28 = local_460;
        do {
          fVar42 = local_30c[lVar29 + -1];
          uVar55 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)fVar42),1);
          uVar58 = vcmpps_avx512vl(ZEXT416((uint)fVar42),local_3e0,1);
          bVar32 = (bool)((byte)uVar55 & (byte)uVar58 & 1);
          if (bVar32 != false) {
            iVar41 = iVar35;
          }
          if (bVar32 != false) {
            iVar28 = (int)lVar29;
          }
          lVar29 = lVar29 + 1;
          local_3e0._0_4_ = (uint)bVar32 * (int)fVar42 + (uint)!bVar32 * local_3e0._0_4_;
        } while (lVar29 != 0xb);
        auVar67 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar66 = ZEXT1664(local_360);
        bvhLights = local_450;
      }
      pBVar26 = local_448;
      args_5 = &local_4a0;
      auVar71 = ZEXT464((uint)auVar71._0_4_);
      auVar69 = ZEXT464((uint)fVar68);
      auVar57 = ZEXT1664(local_3e0);
      iVar35 = iVar35 + 1;
    } while (iVar35 != 3);
    iVar35 = (int)local_4a8;
    if (iVar41 == -1) {
      iVar41 = (end + iVar35) / 2;
    }
    else {
      ppVar36 = (bvhLights->
                super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar38 = (pointer)((long)&ppVar36->first + local_3b0);
      if (end != iVar35) {
        bVar32 = auVar66._0_4_ < local_370._0_4_;
        ppVar39 = ppVar38;
        ppVar38 = ppVar36 + local_3b8;
LAB_003667d3:
        do {
          ppVar36 = ppVar39;
          uVar52 = *(undefined8 *)&(ppVar36->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          uVar9 = (ppVar36->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
          uVar13 = (ppVar36->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          auVar48._0_4_ = auVar67._0_4_ * ((float)uVar52 + (float)uVar9);
          auVar48._4_4_ = auVar67._4_4_ * ((float)((ulong)uVar52 >> 0x20) + (float)uVar13);
          auVar48._8_4_ = auVar67._8_4_ * 0.0;
          auVar48._12_4_ = auVar67._12_4_ * 0.0;
          auVar43 = vsubps_avx(auVar48,auVar66._0_16_);
          auVar70 = auVar43;
          if (bVar32) {
            auVar70 = vdivps_avx(auVar43,local_3d0);
          }
          if ((float)local_430._0_4_ < (float)local_440._0_4_) {
            auVar43 = vmovshdup_avx(auVar43);
            auVar49._0_4_ = auVar43._0_4_ / fVar6;
            auVar49._4_12_ = auVar43._4_12_;
            auVar70 = vinsertps_avx(auVar70,auVar49,0x10);
          }
          else {
            auVar70 = vblendps_avx(auVar70,auVar43,2);
          }
          fVar42 = auVar70._0_4_;
          if (iVar41 != 0) {
            if (iVar41 == 1) {
              auVar70 = vmovshdup_avx(auVar70);
              fVar42 = auVar70._0_4_;
            }
            else {
              fVar42 = (*(float *)((long)&(ppVar36->second).bounds.pMin + 8) +
                       *(float *)((long)&(ppVar36->second).bounds.pMax + 8)) * 0.5 - fVar68;
              fVar42 = (float)((uint)(bVar23 & 1) * (int)(fVar42 / fVar17) +
                              (uint)!(bool)(bVar23 & 1) * (int)fVar42);
            }
          }
          uVar37 = (uint)(fVar42 * 12.0);
          if (uVar37 == 0xc) {
            uVar37 = 0xb;
          }
          local_2e0[0].first = uVar37;
          if ((int)uVar37 < 0) {
LAB_00366c90:
            local_4a0._0_8_ = local_4a0._0_8_ & 0xffffffff00000000;
            ppVar31 = local_2e0;
            iVar41 = 0xd4;
LAB_00366c51:
            LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,iVar41,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x5590ec
                       ,(char (*) [2])0x56f16e,(char (*) [2])0x5590ec,&ppVar31->first,
                       (char (*) [2])0x56f16e,&args_5->first);
          }
          local_4a0.first = 0xc;
          if (0xb < uVar37) {
LAB_00366c5c:
            ppVar31 = local_2e0;
            iVar41 = 0xd5;
LAB_00366c10:
            LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,iVar41,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x5590ec,
                       (char (*) [9])"nBuckets",(char (*) [2])0x5590ec,&ppVar31->first,
                       (char (*) [9])"nBuckets",&args_5->first);
          }
          if ((int)uVar37 <= iVar28) {
            ppVar39 = ppVar36 + 1;
            if (ppVar36 + 1 == ppVar38) goto LAB_00366a34;
            goto LAB_003667d3;
          }
          do {
            ppVar39 = ppVar38;
            ppVar3 = ppVar39 + -1;
            ppVar38 = ppVar36;
            if (ppVar3 == ppVar36) goto LAB_00366a34;
            uVar52 = *(undefined8 *)
                      &ppVar39[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
            uVar10 = ppVar39[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            uVar14 = ppVar39[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            auVar50._0_4_ = auVar67._0_4_ * ((float)uVar52 + (float)uVar10);
            auVar50._4_4_ = auVar67._4_4_ * ((float)((ulong)uVar52 >> 0x20) + (float)uVar14);
            auVar50._8_4_ = auVar67._8_4_ * 0.0;
            auVar50._12_4_ = auVar67._12_4_ * 0.0;
            auVar43 = vsubps_avx(auVar50,auVar66._0_16_);
            auVar70 = auVar43;
            if (bVar32) {
              auVar70 = vdivps_avx(auVar43,local_3d0);
            }
            if ((float)local_430._0_4_ < (float)local_440._0_4_) {
              auVar43 = vmovshdup_avx(auVar43);
              auVar51._0_4_ = auVar43._0_4_ / fVar6;
              auVar51._4_12_ = auVar43._4_12_;
              auVar70 = vinsertps_avx(auVar70,auVar51,0x10);
            }
            else {
              auVar70 = vblendps_avx(auVar70,auVar43,2);
            }
            fVar42 = auVar70._0_4_;
            if (iVar41 != 0) {
              if (iVar41 == 1) {
                auVar70 = vmovshdup_avx(auVar70);
                fVar42 = auVar70._0_4_;
              }
              else {
                fVar42 = (*(float *)((long)&ppVar39[-1].second.bounds.pMin + 8) +
                         *(float *)((long)&ppVar39[-1].second.bounds.pMax + 8)) * 0.5 - fVar68;
                fVar42 = (float)((uint)(bVar23 & 1) * (int)(fVar42 / fVar17) +
                                (uint)!(bool)(bVar23 & 1) * (int)fVar42);
              }
            }
            uVar37 = (uint)(fVar42 * 12.0);
            if (uVar37 == 0xc) {
              uVar37 = 0xb;
            }
            local_2e0[0].first = uVar37;
            if ((int)uVar37 < 0) goto LAB_00366c90;
            local_4a0.first = 0xc;
            if (0xb < uVar37) goto LAB_00366c5c;
            ppVar38 = ppVar3;
          } while (iVar28 < (int)uVar37);
          iVar15 = ppVar36->first;
          ppVar36->first = ppVar3->first;
          ppVar3->first = iVar15;
          local_2e0[0]._0_8_ =
               *(undefined8 *)&(ppVar36->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ =
               *(undefined8 *)((long)&(ppVar36->second).bounds.pMin + 8);
          uVar52 = *(undefined8 *)((long)&(ppVar36->second).bounds.pMax + 4);
          uVar59._0_4_ = (ppVar36->second).phi;
          uVar59._4_4_ = (ppVar36->second).w.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar19 = (ppVar36->second).w.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar55 = *(undefined8 *)
                    ((long)&(ppVar36->second).w.super_Tuple3<pbrt::Vector3,_float> + 8);
          uVar60._0_4_ = (ppVar36->second).cosTheta_e;
          uVar60._4_1_ = (ppVar36->second).twoSided;
          uVar60._5_3_ = *(undefined3 *)&(ppVar36->second).field_0x31;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_ = (undefined5)uVar55;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_ =
               (undefined3)((ulong)uVar55 >> 0x28);
          local_2e0[0].second._40_5_ = (undefined5)uVar60;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar52;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)((ulong)uVar52 >> 0x20);
          uVar55 = *(undefined8 *)&ppVar39[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          uVar58 = *(undefined8 *)((long)&ppVar39[-1].second.bounds.pMin + 8);
          uVar53 = *(undefined8 *)((long)&ppVar39[-1].second.bounds.pMax + 4);
          FVar45 = ppVar39[-1].second.phi;
          fVar42 = ppVar39[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar20 = *(undefined8 *)((long)&ppVar39[-1].second.phi + 1);
          uVar21 = *(undefined8 *)
                    ((long)&ppVar39[-1].second.w.super_Tuple3<pbrt::Vector3,_float> + 5);
          uVar22 = *(undefined8 *)((long)&ppVar39[-1].second.cosTheta_o + 1);
          *(undefined8 *)((long)&(ppVar36->second).bounds.pMax + 5) =
               *(undefined8 *)((long)&ppVar39[-1].second.bounds.pMax + 5);
          *(undefined8 *)((long)&(ppVar36->second).phi + 1) = uVar20;
          *(undefined8 *)((long)&(ppVar36->second).w.super_Tuple3<pbrt::Vector3,_float> + 5) =
               uVar21;
          *(undefined8 *)((long)&(ppVar36->second).cosTheta_o + 1) = uVar22;
          *(undefined8 *)&(ppVar36->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float> = uVar55;
          *(undefined8 *)((long)&(ppVar36->second).bounds.pMin + 8) = uVar58;
          *(undefined8 *)((long)&(ppVar36->second).bounds.pMax + 4) = uVar53;
          (ppVar36->second).phi = FVar45;
          (ppVar36->second).w.super_Tuple3<pbrt::Vector3,_float>.x = fVar42;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ =
               (undefined1)(undefined4)uVar59;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = (undefined1)uVar19;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_ =
               (undefined3)((uint)uVar19 >> 8);
          *(ulong *)((long)&ppVar39[-1].second.bounds.pMax + 5) =
               CONCAT17(local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_,
                        (int7)((ulong)uVar52 >> 8));
          *(ulong *)((long)&ppVar39[-1].second.phi + 1) =
               CONCAT17(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_,
                        (int7)((ulong)uVar59 >> 8));
          *(ulong *)((long)&ppVar39[-1].second.w.super_Tuple3<pbrt::Vector3,_float> + 5) =
               CONCAT53(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_,
                        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_);
          *(ulong *)((long)&ppVar39[-1].second.cosTheta_o + 1) =
               CONCAT53(local_2e0[0].second._40_5_,
                        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_);
          *(undefined8 *)&ppVar39[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
               local_2e0[0]._0_8_;
          *(undefined8 *)((long)&ppVar39[-1].second.bounds.pMin + 8) =
               local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          *(undefined8 *)((long)&ppVar39[-1].second.bounds.pMax + 4) = uVar52;
          ppVar39[-1].second.phi = (Float)(undefined4)uVar59;
          ppVar39[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar59._4_4_;
          ppVar39 = ppVar36 + 1;
          local_2e0[0].second.cosTheta_e._1_3_ = uVar60._5_3_;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar19;
          local_2e0[0].second.phi = (Float)uVar59._4_4_;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (float)(undefined4)uVar59;
        } while (ppVar3 != ppVar36 + 1);
        ppVar38 = ppVar36 + 1;
      }
LAB_00366a34:
      iVar41 = (int)((ulong)((long)ppVar38 -
                            (long)(bvhLights->
                                  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      if (iVar41 == iVar35 || iVar41 == end) {
        iVar41 = (end + iVar35) / 2;
      }
      if ((iVar41 <= iVar35) || (end <= iVar41)) {
        LogFatal<char_const(&)[25]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                   ,0xdb,"Check failed: %s",(char (*) [25])"mid > start && mid < end");
      }
    }
    sVar24 = (local_448->nodes).nStored;
    local_2e0[0].first = 0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    local_2e0[0].second.phi = 0.0;
    pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::
    push_back(&local_448->nodes,(LightBVHNode *)local_2e0);
    uVar25 = local_4ac;
    local_4a0.first = 0x40;
    local_2e0[0].first = depth;
    if (0x3f < depth) {
      LogFatal<char_const(&)[6],char_const(&)[3],char_const(&)[6],int&,char_const(&)[3],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                 ,0xe1,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0xa220dd,
                 (char (*) [3])0xa27db0,(char (*) [6])0xa220dd,&local_2e0[0].first,
                 (char (*) [3])0xa27db0,&local_4a0.first);
    }
    buildBVH(local_2e0,pBVar26,bvhLights,(int)local_4a8,iVar41,local_4ac,depth + 1,alloc);
    iVar28 = (int)sVar24;
    local_4a0.first = iVar28 + 1;
    local_420.first = local_2e0[0].first;
    if (iVar28 + 1 != local_2e0[0].first) {
      LogFatal<char_const(&)[14],char_const(&)[13],char_const(&)[14],int&,char_const(&)[13],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                 ,0xe4,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [14])"nodeIndex + 1"
                 ,(char (*) [13])"child0.first",(char (*) [14])"nodeIndex + 1",&local_4a0.first,
                 (char (*) [13])"child0.first",&local_420.first);
    }
    buildBVH(&local_4a0,pBVar26,bvhLights,iVar41,end,uVar25 | 1 << (depth & 0x1fU),depth + 1,alloc);
    Union((LightBounds *)&local_420,&local_2e0[0].second,&local_4a0.second);
    CompactLightBounds::CompactLightBounds
              ((CompactLightBounds *)&local_344,(LightBounds *)&local_420,&pBVar26->allLightBounds);
    pLVar16 = (pBVar26->nodes).ptr;
    *(ulong *)(pLVar16[iVar28].lightBounds.qb[0] + 2) =
         CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                  local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
    pLVar4 = pLVar16 + iVar28;
    (pLVar4->lightBounds).w =
         (OctahedralVector)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    (pLVar4->lightBounds).phi = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    *(undefined8 *)&(pLVar4->lightBounds).field_2 = local_344.bounds._8_8_;
    pLVar16[iVar28].field_1 =
         (anon_struct_4_2_cf919bac_for_LightBVHNode_1)(local_4a0.first & 0x7fffffff);
    uVar52 = CONCAT44(local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y,
                      local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x);
    uVar53 = CONCAT44(local_420.second.phi,
                      local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z);
    uVar55 = CONCAT44(local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z,
                      local_420.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y);
    uVar58 = CONCAT44(local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.x,local_420.second.phi);
    uVar59 = CONCAT44(local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.z,
                      local_420.second.w.super_Tuple3<pbrt::Vector3,_float>.y);
    uVar60 = CONCAT35(local_420.second.cosTheta_e._1_3_,local_420.second._40_5_);
    local_458->first = iVar28;
  }
  (local_458->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_420.first;
  (local_458->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  *(undefined8 *)&(local_458->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_420.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
  (local_458->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar52;
  (local_458->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar52 >> 0x20);
  (local_458->second).phi = (Float)(int)uVar53;
  (local_458->second).w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar53 >> 0x20);
  *(undefined8 *)&(local_458->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar55;
  (local_458->second).w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar58;
  (local_458->second).w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar58 >> 0x20);
  *(undefined8 *)&(local_458->second).w.super_Tuple3<pbrt::Vector3,_float>.z = uVar59;
  (local_458->second).cosTheta_e = (Float)(int)uVar60;
  (local_458->second).twoSided = (bool)(char)((ulong)uVar60 >> 0x20);
  *(int3 *)&(local_458->second).field_0x31 = (int3)((ulong)uVar60 >> 0x28);
  return local_458;
}

Assistant:

std::pair<int, LightBounds> BVHLightSampler::buildBVH(
    std::vector<std::pair<int, LightBounds>> &bvhLights, int start, int end,
    uint32_t bitTrail, int depth, Allocator alloc) {
    CHECK_LT(start, end);
    // Initialize leaf node if only a single light remains
    if (end - start == 1) {
        int nodeIndex = nodes.size();
        CompactLightBounds cb(bvhLights[start].second, allLightBounds);
        int lightIndex = bvhLights[start].first;
        nodes.push_back(LightBVHNode::MakeLeaf(lightIndex, cb));
        lightToBitTrail.Insert(lights[lightIndex], bitTrail);
        return {nodeIndex, bvhLights[start].second};
    }

    // Choose split dimension and position using modified SAH
    // Compute bounds and centroid bounds for lights
    Bounds3f bounds, centroidBounds;
    for (int i = start; i < end; ++i) {
        const LightBounds &lb = bvhLights[i].second;
        bounds = Union(bounds, lb.bounds);
        centroidBounds = Union(centroidBounds, lb.Centroid());
    }

    Float minCost = Infinity;
    int minCostSplitBucket = -1, minCostSplitDim = -1;
    constexpr int nBuckets = 12;
    for (int dim = 0; dim < 3; ++dim) {
        // Compute minimum cost bucket for splitting along dimension _dim_
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim])
            continue;
        // Compute _LightBounds_ for each bucket
        LightBounds bucketLightBounds[nBuckets];
        for (int i = start; i < end; ++i) {
            Point3f pc = bvhLights[i].second.Centroid();
            int b = nBuckets * centroidBounds.Offset(pc)[dim];
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            bucketLightBounds[b] = Union(bucketLightBounds[b], bvhLights[i].second);
        }

        // Compute costs for splitting lights after each bucket
        Float cost[nBuckets - 1];
        for (int i = 0; i < nBuckets - 1; ++i) {
            // Find _LightBounds_ for lights below and above bucket split
            LightBounds b0, b1;
            for (int j = 0; j <= i; ++j)
                b0 = Union(b0, bucketLightBounds[j]);
            for (int j = i + 1; j < nBuckets; ++j)
                b1 = Union(b1, bucketLightBounds[j]);

            // Compute final light split cost for bucket
            cost[i] = EvaluateCost(b0, bounds, dim) + EvaluateCost(b1, bounds, dim);
        }

        // Find light split that minimizes SAH metric
        for (int i = 1; i < nBuckets - 1; ++i) {
            if (cost[i] > 0 && cost[i] < minCost) {
                minCost = cost[i];
                minCostSplitBucket = i;
                minCostSplitDim = dim;
            }
        }
    }

    // Partition lights according to chosen split
    int mid;
    if (minCostSplitDim == -1) {
        mid = (start + end) / 2;
    } else {
        const auto *pmid = std::partition(
            &bvhLights[start], &bvhLights[end - 1] + 1,
            [=](const std::pair<int, LightBounds> &l) {
                int b = nBuckets *
                        centroidBounds.Offset(l.second.Centroid())[minCostSplitDim];
                if (b == nBuckets)
                    b = nBuckets - 1;
                CHECK_GE(b, 0);
                CHECK_LT(b, nBuckets);
                return b <= minCostSplitBucket;
            });
        mid = pmid - &bvhLights[0];
        if (mid == start || mid == end)
            mid = (start + end) / 2;
        CHECK(mid > start && mid < end);
    }

    // Allocate interior _LightBVHNode_ and recursively initialize children
    int nodeIndex = nodes.size();
    nodes.push_back(LightBVHNode());
    CHECK_LT(depth, 64);
    std::pair<int, LightBounds> child0 =
        buildBVH(bvhLights, start, mid, bitTrail, depth + 1, alloc);
    CHECK_EQ(nodeIndex + 1, child0.first);
    std::pair<int, LightBounds> child1 =
        buildBVH(bvhLights, mid, end, bitTrail | (1u << depth), depth + 1, alloc);

    // Initialize interior node and return node index and bounds
    LightBounds lb = Union(child0.second, child1.second);
    CompactLightBounds cb(lb, allLightBounds);
    nodes[nodeIndex] = LightBVHNode::MakeInterior(child1.first, cb);
    return {nodeIndex, lb};
}